

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O1

void __thiscall serial::Serial::setPort(Serial *this,string *port)

{
  SerialImpl *this_00;
  SerialImpl *this_01;
  bool bVar1;
  int __oflag;
  int __fd;
  string *psVar2;
  
  this_00 = this->pimpl_;
  psVar2 = port;
  SerialImpl::readLock(this_00);
  __fd = (int)psVar2;
  this_01 = this->pimpl_;
  SerialImpl::writeLock(this_01);
  bVar1 = SerialImpl::isOpen(this->pimpl_);
  if (bVar1) {
    SerialImpl::close(this->pimpl_,__fd);
  }
  SerialImpl::setPort(this->pimpl_,port);
  if (bVar1) {
    SerialImpl::open(this->pimpl_,(char *)port,__oflag);
  }
  SerialImpl::writeUnlock(this_01);
  SerialImpl::readUnlock(this_00);
  return;
}

Assistant:

void
Serial::setPort (const string &port)
{
  ScopedReadLock rlock(this->pimpl_);
  ScopedWriteLock wlock(this->pimpl_);
  bool was_open = pimpl_->isOpen ();
  if (was_open) close();
  pimpl_->setPort (port);
  if (was_open) open ();
}